

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int parse_escaped_codeunit(xmlRegParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  int iVar3;
  long lVar4;
  
  pxVar2 = ctxt->cur;
  lVar4 = 0;
  iVar3 = 0;
  do {
    ctxt->cur = pxVar2 + lVar4 + 1;
    iVar3 = iVar3 * 0x10;
    bVar1 = pxVar2[lVar4 + 1];
    if ((byte)(bVar1 - 0x30) < 10) {
      iVar3 = iVar3 + (uint)bVar1 + -0x30;
    }
    else if ((byte)(bVar1 + 0xbf) < 6) {
      iVar3 = iVar3 + (uint)bVar1 + -0x37;
    }
    else {
      if (5 < (byte)(bVar1 + 0x9f)) {
        ctxt->error = 0x5aa;
        xmlRegexpErrCompile(ctxt,"Expecting hex digit");
        return -1;
      }
      iVar3 = iVar3 + (uint)bVar1 + -0x57;
    }
    lVar4 = lVar4 + 1;
  } while ((int)lVar4 != 4);
  return iVar3;
}

Assistant:

static int parse_escaped_codeunit(xmlRegParserCtxtPtr ctxt)
{
    int val = 0, i, cur;
    for (i = 0; i < 4; i++) {
	NEXT;
	val *= 16;
	cur = CUR;
	if (cur >= '0' && cur <= '9') {
	    val += cur - '0';
	} else if (cur >= 'A' && cur <= 'F') {
	    val += cur - 'A' + 10;
	} else if (cur >= 'a' && cur <= 'f') {
	    val += cur - 'a' + 10;
	} else {
	    ERROR("Expecting hex digit");
	    return -1;
	}
    }
    return val;
}